

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O2

int fits_store_Fptr(FITSfile *Fptr,int *status)

{
  long lVar1;
  FITSfile **ppFVar2;
  int iVar3;
  long lVar4;
  
  iVar3 = *status;
  if (iVar3 < 1) {
    lVar4 = 0;
    while (lVar4 != 10000) {
      lVar1 = lVar4 + 1;
      ppFVar2 = FptrTable + lVar4;
      lVar4 = lVar1;
      if (*ppFVar2 == (FITSfile *)0x0) {
        *(FITSfile **)(lVar1 * 8 + 0x222248) = Fptr;
        return iVar3;
      }
    }
  }
  return iVar3;
}

Assistant:

int fits_store_Fptr(FITSfile *Fptr,  /* O - FITS file pointer               */ 
           int *status)              /* IO - error status                   */
/*
   store the new Fptr address for future use by fits_already_open 
*/
{
    int ii;

    if (*status > 0)
        return(*status);

    FFLOCK;
    for (ii = 0; ii < NMAXFILES; ii++) {
        if (FptrTable[ii] == 0) {
            FptrTable[ii] = Fptr;
            break;
        }
    }
    FFUNLOCK;
    return(*status);
}